

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_avx2_256_8.c
# Opt level: O0

void arr_store_si256(int8_t *array,__m256i vWH,int32_t i,int32_t s1Len,int32_t j,int32_t s2Len)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  undefined8 in_XMM0_Qa;
  undefined8 in_YMM0_H;
  undefined1 local_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  
  uStack_49 = (undefined1)((ulong)in_YMM0_H >> 0x38);
  if ((((-1 < in_ESI) && (in_ESI < in_EDX)) && (-1 < in_ECX)) && (in_ECX < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)in_ESI * (long)in_R8D + (long)in_ECX) = uStack_49;
  }
  uStack_4a = (undefined1)((ulong)in_YMM0_H >> 0x30);
  if (((-1 < in_ESI + 1) && (in_ESI + 1 < in_EDX)) && ((-1 < in_ECX + -1 && (in_ECX + -1 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 1) * (long)in_R8D + (long)(in_ECX + -1)) = uStack_4a;
  }
  uStack_4b = (undefined1)((ulong)in_YMM0_H >> 0x28);
  if (((-1 < in_ESI + 2) && (in_ESI + 2 < in_EDX)) && ((-1 < in_ECX + -2 && (in_ECX + -2 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 2) * (long)in_R8D + (long)(in_ECX + -2)) = uStack_4b;
  }
  uStack_4c = (undefined1)((ulong)in_YMM0_H >> 0x20);
  if ((((-1 < in_ESI + 3) && (in_ESI + 3 < in_EDX)) && (-1 < in_ECX + -3)) && (in_ECX + -3 < in_R8D)
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 3) * (long)in_R8D + (long)(in_ECX + -3)) = uStack_4c;
  }
  uStack_4d = (undefined1)((ulong)in_YMM0_H >> 0x18);
  if (((-1 < in_ESI + 4) && (in_ESI + 4 < in_EDX)) && ((-1 < in_ECX + -4 && (in_ECX + -4 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 4) * (long)in_R8D + (long)(in_ECX + -4)) = uStack_4d;
  }
  uStack_4e = (undefined1)((ulong)in_YMM0_H >> 0x10);
  if (((-1 < in_ESI + 5) && (in_ESI + 5 < in_EDX)) && ((-1 < in_ECX + -5 && (in_ECX + -5 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 5) * (long)in_R8D + (long)(in_ECX + -5)) = uStack_4e;
  }
  uStack_4f = (undefined1)((ulong)in_YMM0_H >> 8);
  if ((((-1 < in_ESI + 6) && (in_ESI + 6 < in_EDX)) && (-1 < in_ECX + -6)) && (in_ECX + -6 < in_R8D)
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 6) * (long)in_R8D + (long)(in_ECX + -6)) = uStack_4f;
  }
  uStack_50 = (undefined1)in_YMM0_H;
  if (((-1 < in_ESI + 7) && (in_ESI + 7 < in_EDX)) && ((-1 < in_ECX + -7 && (in_ECX + -7 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 7) * (long)in_R8D + (long)(in_ECX + -7)) = uStack_50;
  }
  if (((-1 < in_ESI + 8) && (in_ESI + 8 < in_EDX)) && ((-1 < in_ECX + -8 && (in_ECX + -8 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 8) * (long)in_R8D + (long)(in_ECX + -8)) = uStack_49;
  }
  if ((((-1 < in_ESI + 9) && (in_ESI + 9 < in_EDX)) && (-1 < in_ECX + -9)) && (in_ECX + -9 < in_R8D)
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 9) * (long)in_R8D + (long)(in_ECX + -9)) = uStack_4a;
  }
  if (((-1 < in_ESI + 10) && (in_ESI + 10 < in_EDX)) &&
     ((-1 < in_ECX + -10 && (in_ECX + -10 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 10) * (long)in_R8D + (long)(in_ECX + -10)) = uStack_4b;
  }
  if (((-1 < in_ESI + 0xb) && (in_ESI + 0xb < in_EDX)) &&
     ((-1 < in_ECX + -0xb && (in_ECX + -0xb < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xb) * (long)in_R8D + (long)(in_ECX + -0xb)) =
         uStack_4c;
  }
  if ((((-1 < in_ESI + 0xc) && (in_ESI + 0xc < in_EDX)) && (-1 < in_ECX + -0xc)) &&
     (in_ECX + -0xc < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xc) * (long)in_R8D + (long)(in_ECX + -0xc)) =
         uStack_4d;
  }
  if (((-1 < in_ESI + 0xd) && (in_ESI + 0xd < in_EDX)) &&
     ((-1 < in_ECX + -0xd && (in_ECX + -0xd < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xd) * (long)in_R8D + (long)(in_ECX + -0xd)) =
         uStack_4e;
  }
  if (((-1 < in_ESI + 0xe) && (in_ESI + 0xe < in_EDX)) &&
     ((-1 < in_ECX + -0xe && (in_ECX + -0xe < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xe) * (long)in_R8D + (long)(in_ECX + -0xe)) =
         uStack_4f;
  }
  if ((((-1 < in_ESI + 0xf) && (in_ESI + 0xf < in_EDX)) && (-1 < in_ECX + -0xf)) &&
     (in_ECX + -0xf < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xf) * (long)in_R8D + (long)(in_ECX + -0xf)) =
         uStack_50;
  }
  uStack_59 = (undefined1)((ulong)in_XMM0_Qa >> 0x38);
  if (((-1 < in_ESI + 0x10) && (in_ESI + 0x10 < in_EDX)) &&
     ((-1 < in_ECX + -0x10 && (in_ECX + -0x10 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x10) * (long)in_R8D + (long)(in_ECX + -0x10)) =
         uStack_59;
  }
  uStack_5a = (undefined1)((ulong)in_XMM0_Qa >> 0x30);
  if (((-1 < in_ESI + 0x11) && (in_ESI + 0x11 < in_EDX)) &&
     ((-1 < in_ECX + -0x11 && (in_ECX + -0x11 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x11) * (long)in_R8D + (long)(in_ECX + -0x11)) =
         uStack_5a;
  }
  uStack_5b = (undefined1)((ulong)in_XMM0_Qa >> 0x28);
  if ((((-1 < in_ESI + 0x12) && (in_ESI + 0x12 < in_EDX)) && (-1 < in_ECX + -0x12)) &&
     (in_ECX + -0x12 < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x12) * (long)in_R8D + (long)(in_ECX + -0x12)) =
         uStack_5b;
  }
  uStack_5c = (undefined1)((ulong)in_XMM0_Qa >> 0x20);
  if (((-1 < in_ESI + 0x13) && (in_ESI + 0x13 < in_EDX)) &&
     ((-1 < in_ECX + -0x13 && (in_ECX + -0x13 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x13) * (long)in_R8D + (long)(in_ECX + -0x13)) =
         uStack_5c;
  }
  uStack_5d = (undefined1)((ulong)in_XMM0_Qa >> 0x18);
  if (((-1 < in_ESI + 0x14) && (in_ESI + 0x14 < in_EDX)) &&
     ((-1 < in_ECX + -0x14 && (in_ECX + -0x14 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x14) * (long)in_R8D + (long)(in_ECX + -0x14)) =
         uStack_5d;
  }
  uStack_5e = (undefined1)((ulong)in_XMM0_Qa >> 0x10);
  if ((((-1 < in_ESI + 0x15) && (in_ESI + 0x15 < in_EDX)) && (-1 < in_ECX + -0x15)) &&
     (in_ECX + -0x15 < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x15) * (long)in_R8D + (long)(in_ECX + -0x15)) =
         uStack_5e;
  }
  uStack_5f = (undefined1)((ulong)in_XMM0_Qa >> 8);
  if (((-1 < in_ESI + 0x16) && (in_ESI + 0x16 < in_EDX)) &&
     ((-1 < in_ECX + -0x16 && (in_ECX + -0x16 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x16) * (long)in_R8D + (long)(in_ECX + -0x16)) =
         uStack_5f;
  }
  local_60 = (undefined1)in_XMM0_Qa;
  if (((-1 < in_ESI + 0x17) && (in_ESI + 0x17 < in_EDX)) &&
     ((-1 < in_ECX + -0x17 && (in_ECX + -0x17 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x17) * (long)in_R8D + (long)(in_ECX + -0x17)) =
         local_60;
  }
  if ((((-1 < in_ESI + 0x18) && (in_ESI + 0x18 < in_EDX)) && (-1 < in_ECX + -0x18)) &&
     (in_ECX + -0x18 < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x18) * (long)in_R8D + (long)(in_ECX + -0x18)) =
         uStack_59;
  }
  if (((-1 < in_ESI + 0x19) && (in_ESI + 0x19 < in_EDX)) &&
     ((-1 < in_ECX + -0x19 && (in_ECX + -0x19 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x19) * (long)in_R8D + (long)(in_ECX + -0x19)) =
         uStack_5a;
  }
  if (((-1 < in_ESI + 0x1a) && (in_ESI + 0x1a < in_EDX)) &&
     ((-1 < in_ECX + -0x1a && (in_ECX + -0x1a < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1a) * (long)in_R8D + (long)(in_ECX + -0x1a)) =
         uStack_5b;
  }
  if ((((-1 < in_ESI + 0x1b) && (in_ESI + 0x1b < in_EDX)) && (-1 < in_ECX + -0x1b)) &&
     (in_ECX + -0x1b < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1b) * (long)in_R8D + (long)(in_ECX + -0x1b)) =
         uStack_5c;
  }
  if (((-1 < in_ESI + 0x1c) && (in_ESI + 0x1c < in_EDX)) &&
     ((-1 < in_ECX + -0x1c && (in_ECX + -0x1c < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1c) * (long)in_R8D + (long)(in_ECX + -0x1c)) =
         uStack_5d;
  }
  if (((-1 < in_ESI + 0x1d) && (in_ESI + 0x1d < in_EDX)) &&
     ((-1 < in_ECX + -0x1d && (in_ECX + -0x1d < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1d) * (long)in_R8D + (long)(in_ECX + -0x1d)) =
         uStack_5e;
  }
  if ((((-1 < in_ESI + 0x1e) && (in_ESI + 0x1e < in_EDX)) && (-1 < in_ECX + -0x1e)) &&
     (in_ECX + -0x1e < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1e) * (long)in_R8D + (long)(in_ECX + -0x1e)) =
         uStack_5f;
  }
  if (((-1 < in_ESI + 0x1f) && (in_ESI + 0x1f < in_EDX)) &&
     ((-1 < in_ECX + -0x1f && (in_ECX + -0x1f < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1f) * (long)in_R8D + (long)(in_ECX + -0x1f)) =
         local_60;
  }
  return;
}

Assistant:

static inline void arr_store_si256(
        int *array,
        __m256i vWH,
        int32_t i,
        int32_t s1Len,
        int32_t j,
        int32_t s2Len)
{
    if (0 <= i+0 && i+0 < s1Len && 0 <= j-0 && j-0 < s2Len) {
        array[1LL*(i+0)*s2Len + (j-0)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 31);
    }
    if (0 <= i+1 && i+1 < s1Len && 0 <= j-1 && j-1 < s2Len) {
        array[1LL*(i+1)*s2Len + (j-1)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 30);
    }
    if (0 <= i+2 && i+2 < s1Len && 0 <= j-2 && j-2 < s2Len) {
        array[1LL*(i+2)*s2Len + (j-2)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 29);
    }
    if (0 <= i+3 && i+3 < s1Len && 0 <= j-3 && j-3 < s2Len) {
        array[1LL*(i+3)*s2Len + (j-3)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 28);
    }
    if (0 <= i+4 && i+4 < s1Len && 0 <= j-4 && j-4 < s2Len) {
        array[1LL*(i+4)*s2Len + (j-4)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 27);
    }
    if (0 <= i+5 && i+5 < s1Len && 0 <= j-5 && j-5 < s2Len) {
        array[1LL*(i+5)*s2Len + (j-5)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 26);
    }
    if (0 <= i+6 && i+6 < s1Len && 0 <= j-6 && j-6 < s2Len) {
        array[1LL*(i+6)*s2Len + (j-6)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 25);
    }
    if (0 <= i+7 && i+7 < s1Len && 0 <= j-7 && j-7 < s2Len) {
        array[1LL*(i+7)*s2Len + (j-7)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 24);
    }
    if (0 <= i+8 && i+8 < s1Len && 0 <= j-8 && j-8 < s2Len) {
        array[1LL*(i+8)*s2Len + (j-8)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 23);
    }
    if (0 <= i+9 && i+9 < s1Len && 0 <= j-9 && j-9 < s2Len) {
        array[1LL*(i+9)*s2Len + (j-9)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 22);
    }
    if (0 <= i+10 && i+10 < s1Len && 0 <= j-10 && j-10 < s2Len) {
        array[1LL*(i+10)*s2Len + (j-10)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 21);
    }
    if (0 <= i+11 && i+11 < s1Len && 0 <= j-11 && j-11 < s2Len) {
        array[1LL*(i+11)*s2Len + (j-11)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 20);
    }
    if (0 <= i+12 && i+12 < s1Len && 0 <= j-12 && j-12 < s2Len) {
        array[1LL*(i+12)*s2Len + (j-12)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 19);
    }
    if (0 <= i+13 && i+13 < s1Len && 0 <= j-13 && j-13 < s2Len) {
        array[1LL*(i+13)*s2Len + (j-13)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 18);
    }
    if (0 <= i+14 && i+14 < s1Len && 0 <= j-14 && j-14 < s2Len) {
        array[1LL*(i+14)*s2Len + (j-14)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 17);
    }
    if (0 <= i+15 && i+15 < s1Len && 0 <= j-15 && j-15 < s2Len) {
        array[1LL*(i+15)*s2Len + (j-15)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 16);
    }
    if (0 <= i+16 && i+16 < s1Len && 0 <= j-16 && j-16 < s2Len) {
        array[1LL*(i+16)*s2Len + (j-16)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 15);
    }
    if (0 <= i+17 && i+17 < s1Len && 0 <= j-17 && j-17 < s2Len) {
        array[1LL*(i+17)*s2Len + (j-17)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 14);
    }
    if (0 <= i+18 && i+18 < s1Len && 0 <= j-18 && j-18 < s2Len) {
        array[1LL*(i+18)*s2Len + (j-18)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 13);
    }
    if (0 <= i+19 && i+19 < s1Len && 0 <= j-19 && j-19 < s2Len) {
        array[1LL*(i+19)*s2Len + (j-19)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 12);
    }
    if (0 <= i+20 && i+20 < s1Len && 0 <= j-20 && j-20 < s2Len) {
        array[1LL*(i+20)*s2Len + (j-20)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 11);
    }
    if (0 <= i+21 && i+21 < s1Len && 0 <= j-21 && j-21 < s2Len) {
        array[1LL*(i+21)*s2Len + (j-21)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 10);
    }
    if (0 <= i+22 && i+22 < s1Len && 0 <= j-22 && j-22 < s2Len) {
        array[1LL*(i+22)*s2Len + (j-22)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 9);
    }
    if (0 <= i+23 && i+23 < s1Len && 0 <= j-23 && j-23 < s2Len) {
        array[1LL*(i+23)*s2Len + (j-23)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 8);
    }
    if (0 <= i+24 && i+24 < s1Len && 0 <= j-24 && j-24 < s2Len) {
        array[1LL*(i+24)*s2Len + (j-24)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 7);
    }
    if (0 <= i+25 && i+25 < s1Len && 0 <= j-25 && j-25 < s2Len) {
        array[1LL*(i+25)*s2Len + (j-25)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 6);
    }
    if (0 <= i+26 && i+26 < s1Len && 0 <= j-26 && j-26 < s2Len) {
        array[1LL*(i+26)*s2Len + (j-26)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 5);
    }
    if (0 <= i+27 && i+27 < s1Len && 0 <= j-27 && j-27 < s2Len) {
        array[1LL*(i+27)*s2Len + (j-27)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 4);
    }
    if (0 <= i+28 && i+28 < s1Len && 0 <= j-28 && j-28 < s2Len) {
        array[1LL*(i+28)*s2Len + (j-28)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 3);
    }
    if (0 <= i+29 && i+29 < s1Len && 0 <= j-29 && j-29 < s2Len) {
        array[1LL*(i+29)*s2Len + (j-29)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 2);
    }
    if (0 <= i+30 && i+30 < s1Len && 0 <= j-30 && j-30 < s2Len) {
        array[1LL*(i+30)*s2Len + (j-30)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 1);
    }
    if (0 <= i+31 && i+31 < s1Len && 0 <= j-31 && j-31 < s2Len) {
        array[1LL*(i+31)*s2Len + (j-31)] = (int8_t)_mm256_extract_epi8_rpl(vWH, 0);
    }
}